

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-pprint.hh
# Opt level: O2

string * __thiscall
tinyusdz::value::print_strided_array_snipped<std::array<tinyusdz::value::half,3ul>>
          (string *__return_storage_ptr__,value *this,uint8_t *vals,size_t stride_bytes,size_t n,
          size_t N)

{
  ulong uVar1;
  size_t i;
  ulong uVar2;
  size_t sVar3;
  value *pvVar4;
  stringstream os;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  sVar3 = n;
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  if ((vals == (uint8_t *)0x6) || (vals == (uint8_t *)0x0)) {
    print_array_snipped<std::array<tinyusdz::value::half,3ul>>
              (__return_storage_ptr__,this,(array<tinyusdz::value::half,_3UL> *)stride_bytes,n,sVar3
              );
  }
  else {
    if (n == 0 || stride_bytes <= n * 2) {
      ::std::operator<<(local_1a8,"[");
      for (sVar3 = 0; stride_bytes != sVar3; sVar3 = sVar3 + 1) {
        if (sVar3 != 0) {
          ::std::operator<<(local_1a8,", ");
        }
        ::std::operator<<(local_1a8,(half3 *)this);
        this = this + (long)vals;
      }
    }
    else {
      uVar1 = stride_bytes - n;
      if (stride_bytes < n) {
        n = stride_bytes;
      }
      ::std::operator<<(local_1a8,"[");
      pvVar4 = this;
      for (uVar2 = 0; n != uVar2; uVar2 = uVar2 + 1) {
        if (uVar2 != 0) {
          ::std::operator<<(local_1a8,", ");
        }
        ::std::operator<<(local_1a8,(half3 *)pvVar4);
        pvVar4 = pvVar4 + (long)vals;
      }
      if (n < uVar1) {
        n = uVar1;
      }
      ::std::operator<<(local_1a8,", ..., ");
      pvVar4 = this + (long)vals * n;
      for (uVar1 = n; uVar1 < stride_bytes; uVar1 = uVar1 + 1) {
        if (n < uVar1) {
          ::std::operator<<(local_1a8,", ");
        }
        ::std::operator<<(local_1a8,(half3 *)pvVar4);
        pvVar4 = pvVar4 + (long)vals;
      }
    }
    ::std::operator<<(local_1a8,"]");
    ::std::__cxx11::stringbuf::str();
  }
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string print_strided_array_snipped(const uint8_t *vals, size_t stride_bytes, const size_t n, size_t N = 16) {
  std::stringstream os;

  if ((stride_bytes == 0) || (stride_bytes == sizeof(T))) { // tightly packed.
    return print_array_snipped(reinterpret_cast<const T*>(vals), n, N);
  }

  if ((N == 0) || ((N * 2) >= n)) {
    os << "[";
    for (size_t i = 0; i < n; i++) {
      if (i > 0) {
        os << ", ";
      }
      os << *reinterpret_cast<const T *>(&vals[i * stride_bytes]);
    }
    os << "]";
  } else {
    size_t head_end = (std::min)(N, n);
    size_t tail_start = (std::max)(n - N, head_end);

    os << "[";

    for (size_t i = 0; i < head_end; i++) {
      if (i > 0) {
        os << ", ";
      }
      os << *reinterpret_cast<const T *>(&vals[i * stride_bytes]);
    }

    os << ", ..., ";

    for (size_t i = tail_start; i < n; i++) {
      if (i > tail_start) {
        os << ", ";
      }
      os << *reinterpret_cast<const T *>(&vals[i * stride_bytes]);
    }

    os << "]";
  }
  return os.str();
}